

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O0

int CorrelationMeter::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  EffectData *pEVar1;
  int local_4c;
  int local_48;
  int n;
  int w2;
  int w1;
  HistoryBuffer *r;
  HistoryBuffer *l;
  EffectData *data;
  int numsamples_local;
  float *buffer_local;
  char *name_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<CorrelationMeter::EffectData>(state);
  n = *(int *)&pEVar1->field_0xc;
  local_48 = *(int *)&pEVar1->field_0x1c;
  for (local_4c = 0; local_4c < numsamples / 2; local_4c = local_4c + 1) {
    buffer[local_4c << 1] = *(float *)(*(long *)&pEVar1->field_0x10 + (long)n * 4);
    n = n + -1;
    if (n < 0) {
      n = *(int *)&pEVar1->field_0x8 + -1;
    }
    if (local_4c * 2 + 1 < numsamples) {
      buffer[local_4c * 2 + 1] = *(float *)(*(long *)&pEVar1->field_0x20 + (long)local_48 * 4);
    }
    local_48 = local_48 + -1;
    if (local_48 < 0) {
      local_48 = *(int *)&pEVar1->field_0x18 + -1;
    }
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        HistoryBuffer& l = data->history[0];
        HistoryBuffer& r = data->history[1];
        int w1 = l.writeindex;
        int w2 = r.writeindex;
        for (int n = 0; n < numsamples / 2; n++)
        {
            buffer[n * 2 + 0] = l.data[w1];
            if (--w1 < 0)
                w1 = l.length - 1;
            if (n * 2 + 1 < numsamples)
                buffer[n * 2 + 1] = r.data[w2];
            if (--w2 < 0)
                w2 = r.length - 1;
        }
        return UNITY_AUDIODSP_OK;
    }